

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O1

void __thiscall
happly::TypedProperty<short>::writeHeader(TypedProperty<short> *this,ostream *outStream)

{
  ostream *poVar1;
  char local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(outStream,"property ",9);
  builtin_strncpy(local_28,"short",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(outStream,local_28,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->super_Property).name._M_dataplus._M_p,
                      (this->super_Property).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

virtual void writeHeader(std::ostream& outStream) override {
    outStream << "property " << typeName<T>() << " " << name << "\n";
  }